

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double.cc
# Opt level: O2

int __thiscall
AddForm::verify(AddForm *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  undefined8 *puVar1;
  Varnode *pVVar2;
  bool bVar3;
  uint uVar4;
  int4 iVar5;
  Varnode *pVVar6;
  undefined7 extraout_var;
  PcodeOp *pPVar8;
  _List_node_base *p_Var9;
  int iVar10;
  Varnode *pVVar7;
  
  this->hi1 = (Varnode *)ctx;
  this->lo1 = (Varnode *)sig;
  uVar4 = PcodeOp::getSlot((PcodeOp *)siglen,(Varnode *)ctx);
  pVVar7 = (Varnode *)(ulong)uVar4;
  this->slot1 = uVar4;
  uVar4 = 0;
  do {
    if (uVar4 == 0) {
      pVVar6 = (Varnode *)Varnode::loneDescend(*(Varnode **)(siglen + 0x48));
      this->add2 = (PcodeOp *)pVVar6;
      pVVar7 = pVVar6;
      if ((pVVar6 == (Varnode *)0x0) ||
         (pVVar7 = *(Varnode **)pVVar6, *(OpCode *)&(pVVar7->loc).base != CPUI_INT_ADD))
      goto LAB_003083da;
      this->reshi = (Varnode *)(pVVar6->defiter)._M_node;
      this->hizext1 = *(Varnode **)(*(long *)(siglen + 0x50) + (1 - (long)this->slot1) * 8);
      iVar5 = PcodeOp::getSlot((PcodeOp *)pVVar6,*(Varnode **)(siglen + 0x48));
      pVVar7 = (Varnode *)
               (&((pVVar6->descend).super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>._M_impl.
                  _M_node.super__List_node_base._M_next)->_M_next)[1 - iVar5];
LAB_0030828d:
      this->hizext2 = pVVar7;
      for (iVar10 = 0; iVar10 != 2; iVar10 = iVar10 + 1) {
        if (uVar4 == 2) {
          pVVar7 = this->hizext1;
          if (((ulong)*(_func_int ***)&pVVar7->flags & 0x10) != 0) {
            pPVar8 = (PcodeOp *)(((string *)&pVVar7->def)->_M_dataplus)._M_p;
            this->zextop = pPVar8;
            pVVar7 = (Varnode *)0x0;
            goto LAB_0030830d;
          }
        }
        else if (iVar10 == 0) {
          pVVar7 = this->hizext1;
          if (((ulong)*(_func_int ***)&pVVar7->flags & 0x10) != 0) {
            pPVar8 = (PcodeOp *)(((string *)&pVVar7->def)->_M_dataplus)._M_p;
            this->zextop = pPVar8;
            pVVar7 = this->hizext2;
            goto LAB_0030830d;
          }
        }
        else {
          pVVar7 = this->hizext2;
          if (((ulong)*(_func_int ***)&pVVar7->flags & 0x10) != 0) {
            pPVar8 = (PcodeOp *)(((string *)&pVVar7->def)->_M_dataplus)._M_p;
            this->zextop = pPVar8;
            pVVar7 = this->hizext1;
LAB_0030830d:
            this->hi2 = pVVar7;
            bVar3 = checkForCarry(this,pPVar8);
            pVVar7 = (Varnode *)CONCAT71(extraout_var,bVar3);
            if (bVar3) {
              pVVar6 = this->lo1;
              p_Var9 = (pVVar6->descend).super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>.
                       _M_impl._M_node.super__List_node_base._M_next;
LAB_0030832d:
              if (p_Var9 != (_List_node_base *)&pVVar6->descend) {
                pPVar8 = (PcodeOp *)p_Var9[1]._M_next;
                this->loadd = pPVar8;
                p_Var9 = p_Var9->_M_next;
                pVVar7 = (Varnode *)pPVar8->opcode;
                if (*(OpCode *)&(pVVar7->loc).base == CPUI_INT_ADD) {
                  iVar5 = PcodeOp::getSlot(pPVar8,this->lo1);
                  pVVar7 = (pPVar8->inrefs).
                           super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                           super__Vector_impl_data._M_start[1 - iVar5];
                  pVVar2 = this->lo2;
                  if (pVVar2 == (Varnode *)0x0) {
                    if ((((ulong)*(_func_int ***)&pVVar7->flags & 2) == 0) ||
                       ((pVVar7->loc).offset != this->negconst)) goto LAB_0030832d;
                    this->lo2 = pVVar7;
                  }
                  else if ((pVVar2->flags & 2) == 0) {
                    pPVar8 = this->loadd;
                    iVar5 = PcodeOp::getSlot(pPVar8,this->lo1);
                    pVVar7 = (pPVar8->inrefs).
                             super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                             super__Vector_impl_data._M_start[1 - iVar5];
                    if (pVVar7 != this->lo2) goto LAB_0030832d;
                  }
                  else if ((((ulong)*(_func_int ***)&pVVar7->flags & 2) == 0) ||
                          ((pVVar2->loc).offset != (pVVar7->loc).offset)) goto LAB_0030832d;
                  pVVar7 = this->loadd->output;
                  this->reslo = pVVar7;
                  goto LAB_003083f7;
                }
                goto LAB_0030832d;
              }
            }
          }
        }
      }
    }
    else {
      if (uVar4 != 1) {
        if (uVar4 == 3) {
LAB_003083f7:
          return (int)CONCAT71((int7)((ulong)pVVar7 >> 8),uVar4 < 3);
        }
        this->reshi = *(Varnode **)(siglen + 0x48);
        this->hizext1 = *(Varnode **)(*(long *)(siglen + 0x50) + (1 - (long)this->slot1) * 8);
        pVVar7 = (Varnode *)0x0;
        goto LAB_0030828d;
      }
      pVVar7 = *(Varnode **)(*(long *)(siglen + 0x50) + (1 - (long)this->slot1) * 8);
      if (((ulong)*(_func_int ***)&pVVar7->flags & 0x10) != 0) {
        pVVar7 = (Varnode *)(((string *)&pVVar7->def)->_M_dataplus)._M_p;
        this->add2 = (PcodeOp *)pVVar7;
        if (*(int *)(*(long *)pVVar7 + 0x10) == 0x13) {
          this->reshi = *(Varnode **)(siglen + 0x48);
          puVar1 = *(undefined8 **)
                    &(pVVar7->descend).super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>.
                     _M_impl._M_node.super__List_node_base;
          this->hizext1 = (Varnode *)*puVar1;
          pVVar7 = (Varnode *)puVar1[1];
          goto LAB_0030828d;
        }
      }
    }
LAB_003083da:
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

bool AddForm::verify(Varnode *h,Varnode *l,PcodeOp *op)

{
  hi1 = h;
  lo1 = l;
  slot1 = op->getSlot(hi1);
  for(int4 i=0;i<3;++i) {
    if (i==0) {		// Assume we have to descend one more add
      add2 = op->getOut()->loneDescend();
      if (add2 == (PcodeOp *)0) continue;
      if (add2->code() != CPUI_INT_ADD) continue;
      reshi = add2->getOut();
      hizext1 = op->getIn(1-slot1);
      hizext2 = add2->getIn(1-add2->getSlot(op->getOut()));
    }
    else if (i==1) {		// Assume we are at the bottom most of two adds
      Varnode *tmpvn = op->getIn(1-slot1);
      if (!tmpvn->isWritten()) continue;
      add2 = tmpvn->getDef();
      if (add2->code() != CPUI_INT_ADD) continue;
      reshi = op->getOut();
      hizext1 = add2->getIn(0);
      hizext2 = add2->getIn(1);
    }
    else {			// Assume there is only one add, with second implied add by 0
      reshi = op->getOut();
      hizext1 = op->getIn(1-slot1);
      hizext2 = (Varnode *)0;
    }
    for(int4 j=0;j<2;++j) {
      if (i==2) {		// hi2 is an implied 0
	if (!hizext1->isWritten()) continue;
	zextop = hizext1->getDef();
	hi2 = (Varnode *)0;
      }
      else if (j==0) {
	if (!hizext1->isWritten()) continue;
	zextop = hizext1->getDef();
	hi2 = hizext2;
      }
      else {
	if (!hizext2->isWritten()) continue;
	zextop = hizext2->getDef();
	hi2 = hizext1;
      }
      if (!checkForCarry(zextop)) continue; // Calculate lo2 and negconst

      list<PcodeOp *>::const_iterator iter2,enditer2;
      iter2 = lo1->beginDescend();
      enditer2 = lo1->endDescend();
      while(iter2 != enditer2) {
	loadd = *iter2;
	++iter2;
	if (loadd->code() != CPUI_INT_ADD) continue;
	Varnode *tmpvn = loadd->getIn(1-loadd->getSlot(lo1));
	if (lo2 == (Varnode *)0) {
	  if (!tmpvn->isConstant()) continue;
	  if (tmpvn->getOffset() != negconst) continue;	// Must add same constant used to calculate CARRY
	  lo2 = tmpvn;
	}
	else if (lo2->isConstant()) {
	  if (!tmpvn->isConstant()) continue;
	  if (lo2->getOffset() != tmpvn->getOffset()) continue;
	}
	else if (loadd->getIn(1-loadd->getSlot(lo1)) != lo2) // Must add same value used to calculate CARRY
	  continue;
	reslo = loadd->getOut();
	return true;
      }
    }
  }
  return false;
}